

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_0000_0999.cpp
# Opt level: O3

void __thiscall psy::C::DeclarationBinderTester::case0055(DeclarationBinderTester *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Decl *pDVar3;
  Ty *pTVar4;
  Expectation *pEVar5;
  socklen_t __len;
  string local_6d0;
  string local_6b0;
  string local_690;
  long *local_670 [2];
  long local_660 [2];
  Expectation local_650;
  Expectation local_598;
  Decl local_4e0;
  Decl local_418;
  Decl local_350;
  Decl local_288;
  Decl local_1c0;
  Decl local_f8;
  
  local_670[0] = local_660;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_670,"void x ( int * * y , double z) ;","");
  Expectation::Expectation(&local_650);
  Decl::Decl(&local_f8);
  local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_690,"x","");
  pDVar3 = Decl::Function(&local_f8,&local_690,File);
  pDVar3 = Ty::Void(&pDVar3->ty_,None);
  pDVar3 = Ty::Derived(&pDVar3->ty_,Function,None,None);
  pTVar4 = Ty::addParam(&pDVar3->ty_);
  pDVar3 = Ty::Basic(pTVar4,Int_S,None);
  pTVar4 = Ty::atParam(&pDVar3->ty_);
  pDVar3 = Ty::Derived(pTVar4,Pointer,None,None);
  pTVar4 = Ty::atParam(&pDVar3->ty_);
  pDVar3 = Ty::Derived(pTVar4,Pointer,None,None);
  pTVar4 = Ty::addParam(&pDVar3->ty_);
  pDVar3 = Ty::Basic(pTVar4,Double,None);
  local_4e0.ident_._M_dataplus._M_p = (pointer)&local_4e0.ident_.field_2;
  pcVar2 = (pDVar3->ident_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4e0,pcVar2,pcVar2 + (pDVar3->ident_)._M_string_length);
  local_4e0.ns_ = pDVar3->ns_;
  local_4e0.declK_ = pDVar3->declK_;
  local_4e0.tyDeclK_ = pDVar3->tyDeclK_;
  local_4e0.symK_ = pDVar3->symK_;
  local_4e0.scopeK_ = pDVar3->scopeK_;
  Ty::Ty(&local_4e0.ty_,&pDVar3->ty_);
  pEVar5 = Expectation::declaration(&local_650,&local_4e0);
  Decl::Decl(&local_1c0);
  local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b0,"y","");
  pDVar3 = Decl::Object(&local_1c0,&local_6b0,ParameterDeclaration,FunctionPrototype);
  pDVar3 = Ty::Basic(&pDVar3->ty_,Int_S,None);
  pDVar3 = Ty::Derived(&pDVar3->ty_,Pointer,None,None);
  pDVar3 = Ty::Derived(&pDVar3->ty_,Pointer,None,None);
  local_418.ident_._M_dataplus._M_p = (pointer)&local_418.ident_.field_2;
  pcVar2 = (pDVar3->ident_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_418,pcVar2,pcVar2 + (pDVar3->ident_)._M_string_length);
  local_418.ns_ = pDVar3->ns_;
  local_418.declK_ = pDVar3->declK_;
  local_418.tyDeclK_ = pDVar3->tyDeclK_;
  local_418.symK_ = pDVar3->symK_;
  local_418.scopeK_ = pDVar3->scopeK_;
  Ty::Ty(&local_418.ty_,&pDVar3->ty_);
  pEVar5 = Expectation::declaration(pEVar5,&local_418);
  Decl::Decl(&local_288);
  local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d0,"z","");
  __len = 2;
  pDVar3 = Decl::Object(&local_288,&local_6d0,ParameterDeclaration,FunctionPrototype);
  pDVar3 = Ty::Basic(&pDVar3->ty_,Double,None);
  paVar1 = &local_350.ident_.field_2;
  pcVar2 = (pDVar3->ident_)._M_dataplus._M_p;
  local_350.ident_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_350,pcVar2,pcVar2 + (pDVar3->ident_)._M_string_length);
  local_350.ns_ = pDVar3->ns_;
  local_350.declK_ = pDVar3->declK_;
  local_350.tyDeclK_ = pDVar3->tyDeclK_;
  local_350.symK_ = pDVar3->symK_;
  local_350.scopeK_ = pDVar3->scopeK_;
  Ty::Ty(&local_350.ty_,&pDVar3->ty_);
  pEVar5 = Expectation::declaration(pEVar5,&local_350);
  Expectation::Expectation(&local_598,pEVar5);
  bind(this,(int)local_670,(sockaddr *)&local_598,__len);
  if (local_598.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_598.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_598.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_598.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_598.declarations_);
  if (local_598.syntaxKinds_.
      super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_598.syntaxKinds_.
                    super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_598.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_598.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598.ambiguityText_._M_dataplus._M_p != &local_598.ambiguityText_.field_2) {
    operator_delete(local_598.ambiguityText_._M_dataplus._M_p,
                    local_598.ambiguityText_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_598.descriptorsW_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_598.descriptorsE_);
  Ty::~Ty(&local_350.ty_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350.ident_._M_dataplus._M_p != paVar1) {
    operator_delete(local_350.ident_._M_dataplus._M_p,
                    local_350.ident_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
    operator_delete(local_6d0._M_dataplus._M_p,local_6d0.field_2._M_allocated_capacity + 1);
  }
  Ty::~Ty(&local_288.ty_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.ident_._M_dataplus._M_p != &local_288.ident_.field_2) {
    operator_delete(local_288.ident_._M_dataplus._M_p,
                    local_288.ident_.field_2._M_allocated_capacity + 1);
  }
  Ty::~Ty(&local_418.ty_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418.ident_._M_dataplus._M_p != &local_418.ident_.field_2) {
    operator_delete(local_418.ident_._M_dataplus._M_p,
                    local_418.ident_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
    operator_delete(local_6b0._M_dataplus._M_p,local_6b0.field_2._M_allocated_capacity + 1);
  }
  Ty::~Ty(&local_1c0.ty_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0.ident_._M_dataplus._M_p != &local_1c0.ident_.field_2) {
    operator_delete(local_1c0.ident_._M_dataplus._M_p,
                    local_1c0.ident_.field_2._M_allocated_capacity + 1);
  }
  Ty::~Ty(&local_4e0.ty_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0.ident_._M_dataplus._M_p != &local_4e0.ident_.field_2) {
    operator_delete(local_4e0.ident_._M_dataplus._M_p,
                    local_4e0.ident_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690._M_dataplus._M_p != &local_690.field_2) {
    operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
  }
  Ty::~Ty(&local_f8.ty_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.ident_._M_dataplus._M_p != &local_f8.ident_.field_2) {
    operator_delete(local_f8.ident_._M_dataplus._M_p,
                    local_f8.ident_.field_2._M_allocated_capacity + 1);
  }
  if (local_650.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_650.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_650.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_650.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_650.declarations_);
  if (local_650.syntaxKinds_.
      super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_650.syntaxKinds_.
                    super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_650.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_650.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650.ambiguityText_._M_dataplus._M_p != &local_650.ambiguityText_.field_2) {
    operator_delete(local_650.ambiguityText_._M_dataplus._M_p,
                    local_650.ambiguityText_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_650.descriptorsW_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_650.descriptorsE_);
  if (local_670[0] != local_660) {
    operator_delete(local_670[0],local_660[0] + 1);
  }
  return;
}

Assistant:

void DeclarationBinderTester::case0055()
{
    bind("void x ( int * * y , double z) ;",
         Expectation()
         .declaration(Decl()
                  .Function("x", ScopeKind::File)
                  .ty_.Void()
                  .ty_.Derived(TypeKind::Function)
                  .ty_.addParam().Basic(BasicTypeKind::Int_S)
                  .ty_.atParam().Derived(TypeKind::Pointer)
                  .ty_.atParam().Derived(TypeKind::Pointer)
                  .ty_.addParam().Basic(BasicTypeKind::Double))
         .declaration(Decl()
                  .Object("y", SymbolKind::ParameterDeclaration, ScopeKind::FunctionPrototype)
                  .ty_.Basic(BasicTypeKind::Int_S)
                  .ty_.Derived(TypeKind::Pointer)
                  .ty_.Derived(TypeKind::Pointer))
         .declaration(Decl()
                  .Object("z", SymbolKind::ParameterDeclaration, ScopeKind::FunctionPrototype)
                  .ty_.Basic(BasicTypeKind::Double)));
}